

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcatenationExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_1,
          SourceRange *args_2)

{
  SourceRange sourceRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> operands;
  ConcatenationExpression *pCVar1;
  SourceLocation in_RCX;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (ConcatenationExpression *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  operands._M_extent._M_extent_value = in_RSI._M_extent_value;
  operands._M_ptr = in_RDX;
  sourceRange.endLoc = in_RCX;
  sourceRange.startLoc = *(SourceLocation *)(in_RDX + 1);
  ast::ConcatenationExpression::ConcatenationExpression
            ((ConcatenationExpression *)*in_RDX,*(Type **)((long)in_RCX + 8),operands,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }